

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_4afdb9::CastExpr::printLeft(CastExpr *this,OutputStream *S)

{
  StringView R;
  StringView R_00;
  StringView R_01;
  
  OutputStream::operator+=(S,this->CastKind);
  R.Last = "";
  R.First = "<";
  OutputStream::operator+=(S,R);
  (*this->To->_vptr_Node[4])(this->To,S);
  R_00.Last = "";
  R_00.First = ">(";
  OutputStream::operator+=(S,R_00);
  (*this->From->_vptr_Node[4])(this->From,S);
  R_01.Last = "";
  R_01.First = ")";
  OutputStream::operator+=(S,R_01);
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    S += CastKind;
    S += "<";
    To->printLeft(S);
    S += ">(";
    From->printLeft(S);
    S += ")";
  }